

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga.c
# Opt level: O2

void xc_gga_initalize(xc_func_type *func,size_t np,xc_gga_out_params *out)

{
  long lVar1;
  
  if (out->zk != (double *)0x0) {
    memset(out->zk,0,(long)(func->dim).zk * np * 8);
  }
  if (out->vrho != (double *)0x0) {
    memset(out->vrho,0,(long)(func->dim).vrho * np * 8);
    memset(out->vsigma,0,(long)(func->dim).vsigma * np * 8);
  }
  if (out->v2rho2 != (double *)0x0) {
    lVar1 = np * 8;
    memset(out->v2rho2,0,(func->dim).v2rho2 * lVar1);
    memset(out->v2rhosigma,0,(func->dim).v2rhosigma * lVar1);
    memset(out->v2sigma2,0,(func->dim).v2sigma2 * lVar1);
  }
  if (out->v3rho3 != (double *)0x0) {
    lVar1 = np * 8;
    memset(out->v3rho3,0,(func->dim).v3rho3 * lVar1);
    memset(out->v3rho2sigma,0,(func->dim).v3rho2sigma * lVar1);
    memset(out->v3rhosigma2,0,(func->dim).v3rhosigma2 * lVar1);
    memset(out->v3sigma3,0,(func->dim).v3sigma3 * lVar1);
  }
  if (out->v4rho4 != (double *)0x0) {
    lVar1 = np * 8;
    memset(out->v4rho4,0,(func->dim).v4rho4 * lVar1);
    memset(out->v4rho3sigma,0,(func->dim).v4rho3sigma * lVar1);
    memset(out->v4rho2sigma2,0,(func->dim).v4rho2sigma2 * lVar1);
    memset(out->v4rhosigma3,0,(func->dim).v4rhosigma3 * lVar1);
    memset(out->v4sigma4,0,(func->dim).v4sigma4 * lVar1);
    return;
  }
  return;
}

Assistant:

void
xc_gga_initalize(const xc_func_type *func, size_t np, xc_gga_out_params *out)
{
  const xc_dimensions *dim = &(func->dim);

    /* initialize output to zero */
  if(out->zk != NULL)
    libxc_memset(out->zk, 0, dim->zk*np*sizeof(double));

  if(out->vrho != NULL){
    libxc_memset(out->vrho,   0, dim->vrho  *np*sizeof(double));
    libxc_memset(out->vsigma, 0, dim->vsigma*np*sizeof(double));
  }

  if(out->v2rho2 != NULL){
    libxc_memset(out->v2rho2,     0, dim->v2rho2    *np*sizeof(double));
    libxc_memset(out->v2rhosigma, 0, dim->v2rhosigma*np*sizeof(double));
    libxc_memset(out->v2sigma2,   0, dim->v2sigma2  *np*sizeof(double));
  }

  if(out->v3rho3 != NULL){
    libxc_memset(out->v3rho3,      0, dim->v3rho3     *np*sizeof(double));
    libxc_memset(out->v3rho2sigma, 0, dim->v3rho2sigma*np*sizeof(double));
    libxc_memset(out->v3rhosigma2, 0, dim->v3rhosigma2*np*sizeof(double));
    libxc_memset(out->v3sigma3,    0, dim->v3sigma3   *np*sizeof(double));
  }

  if(out->v4rho4 != NULL){
    libxc_memset(out->v4rho4,       0, dim->v4rho4      *np*sizeof(double));
    libxc_memset(out->v4rho3sigma,  0, dim->v4rho3sigma *np*sizeof(double));
    libxc_memset(out->v4rho2sigma2, 0, dim->v4rho2sigma2*np*sizeof(double));
    libxc_memset(out->v4rhosigma3,  0, dim->v4rhosigma3 *np*sizeof(double));
    libxc_memset(out->v4sigma4,     0, dim->v4sigma4    *np*sizeof(double));
   }

}